

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbmp.c
# Opt level: O3

int skipheader(_func_int_void_ptr *getin,void *in)

{
  int iVar1;
  
  do {
    iVar1 = (*getin)(in);
    if (iVar1 < 0) {
      return -1;
    }
  } while ((char)iVar1 < '\0');
  return 0;
}

Assistant:

int skipheader(int (*getin)(void *in), void *in)
{
	int i;

	do {
		i = getin(in);
		if(i < 0) {
			return (-1);
		}
	} while(i & 0x80);

	return 0;
}